

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

int lj_cparse(CPState *cp)

{
  CTypeID CVar1;
  CTState *pCVar2;
  undefined8 *puVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  undefined1 local_214 [252];
  undefined1 local_118 [256];
  
  CVar1 = cp->cts->top;
  memcpy(local_214,&cp->cts->sizetab,0x1fc);
  iVar5 = lj_vm_cpcall(cp->L,0,cp,cpcparser);
  if (iVar5 != 0) {
    pCVar2 = cp->cts;
    pCVar2->top = CVar1;
    memcpy(pCVar2->hash,local_118,0x100);
  }
  puVar3 = (undefined8 *)(cp->L->glref).ptr64;
  pcVar4 = (cp->sb).b;
  uVar6 = (ulong)(uint)(*(int *)&(cp->sb).e - (int)pcVar4);
  puVar3[2] = puVar3[2] - uVar6;
  (*(code *)*puVar3)(puVar3[1],pcVar4,uVar6,0);
  return iVar5;
}

Assistant:

int lj_cparse(CPState *cp)
{
  LJ_CTYPE_SAVE(cp->cts);
  int errcode = lj_vm_cpcall(cp->L, NULL, cp, cpcparser);
  if (errcode)
    LJ_CTYPE_RESTORE(cp->cts);
  cp_cleanup(cp);
  return errcode;
}